

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Var.cpp
# Opt level: O1

void __thiscall asl::Var::Var(Var *this,Type t)

{
  this->_type = t;
  switch(t) {
  case SSTRING:
    (this->field_1)._b = false;
    break;
  case STRING:
    Array<char>::alloc((Array<char> *)&(this->field_1)._a,0);
    return;
  case ARRAY:
    Array<asl::Var>::alloc((Array<asl::Var> *)&(this->field_1)._a,0);
    return;
  case DIC:
    Array<asl::Map<asl::String,_asl::Var>::KeyVal>::alloc
              ((Array<asl::Map<asl::String,_asl::Var>::KeyVal> *)&(this->field_1)._a,0);
    return;
  }
  return;
}

Assistant:

Var::Var(Type t)
{
	switch(_type=t)
	{
	case SSTRING: _ss[0] = '\0'; break;
	case STRING: NEW_STRING(_s); break;
	case ARRAY: NEW_ARRAY(_a); break;
	case OBJ: NEW_DIC(_o); break;
	default: break;
	}
}